

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void handleNewWalletRequest(char *initiatorPubKey,json *package)

{
  char *wallet_00;
  bool bVar1;
  int iVar2;
  reference pvVar3;
  char *pcVar4;
  size_type sVar5;
  size_t sVar6;
  void *pvVar7;
  ostream *poVar8;
  string_t local_118;
  char *local_f8;
  char *wallet_name;
  char *local_d0;
  char *device_hub;
  void *local_a8;
  char *pubkey;
  char *local_80;
  char *device_address;
  undefined1 local_70 [4];
  int i;
  char *local_50;
  char *initiator_device_hub;
  undefined1 local_40 [4];
  int otherCosignersSize;
  char *local_20;
  char *wallet;
  json *package_local;
  char *initiatorPubKey_local;
  
  wallet = (char *)package;
  package_local = (json *)initiatorPubKey;
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)package,"body");
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pvVar3,"wallet");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::dump((string_t *)local_40,pvVar3,-1,' ',false,strict);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::__cxx11::string::~string((string *)local_40);
  local_20 = pcVar4;
  if (pcVar4 == (char *)0x0) {
    poVar8 = std::operator<<((ostream *)&std::clog,"Wallet must be a char");
    std::ostream::operator<<((ostream *)poVar8,std::endl<char,std::char_traits<char>>);
  }
  else {
    bVar1 = std::type_info::operator==
                      ((type_info *)
                       &nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::typeinfo,(type_info *)&bool::typeinfo);
    if (bVar1) {
      pvVar3 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)wallet,"body");
      pvVar3 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)pvVar3,"is_single_address");
      bVar1 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator_bool<bool,_0>(pvVar3);
      if (bVar1) {
        bVar1 = std::type_info::operator==
                          ((type_info *)
                           &nlohmann::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            ::typeinfo,
                           (type_info *)
                           &nlohmann::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            ::typeinfo);
        if (!bVar1) {
          poVar8 = std::operator<<((ostream *)&std::clog,"other_cosigners must be an array");
          std::ostream::operator<<((ostream *)poVar8,std::endl<char,std::char_traits<char>>);
          return;
        }
        pvVar3 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)wallet,"body");
        pvVar3 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)pvVar3,"other_cosigners");
        sVar5 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::size(pvVar3);
        initiator_device_hub._4_4_ = (int)sVar5;
        pvVar3 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)wallet,"body");
        pvVar3 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)pvVar3,"other_cosigners");
        bVar1 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::empty(pvVar3);
        if (!bVar1) {
          pvVar3 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)wallet,"device_hub");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::dump((string_t *)local_70,pvVar3,-1,' ',false,strict);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          std::__cxx11::string::~string((string *)local_70);
          local_50 = pcVar4;
          if ((pcVar4 != (char *)0x0) && (sVar6 = strlen(pcVar4), sVar6 < 0x1e)) {
            newWallet.isCreating = true;
            strcpy(newWallet.initiatorHub,local_50);
            memcpy(newWallet.initiatorPubKey,package_local,0x2d);
            memcpy(newWallet.id,local_20,0x2d);
            for (device_address._4_4_ = 0; device_address._4_4_ < initiator_device_hub._4_4_;
                device_address._4_4_ = device_address._4_4_ + 1) {
              pvVar3 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)wallet,"body");
              pvVar3 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)pvVar3,"other_cosigners");
              pvVar3 = nlohmann::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       ::operator[](pvVar3,(long)device_address._4_4_);
              pvVar3 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)pvVar3,"device_address");
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::dump((string_t *)&pubkey,pvVar3,-1,' ',false,strict);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              std::__cxx11::string::~string((string *)&pubkey);
              local_80 = pcVar4;
              pvVar3 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)wallet,"body");
              pvVar3 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)pvVar3,"other_cosigners");
              pvVar3 = nlohmann::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       ::operator[](pvVar3,(long)device_address._4_4_);
              pvVar3 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)pvVar3,"pubkey");
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::dump((string_t *)&device_hub,pvVar3,-1,' ',false,strict);
              pvVar7 = (void *)std::__cxx11::string::c_str();
              std::__cxx11::string::~string((string *)&device_hub);
              local_a8 = pvVar7;
              pvVar3 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)wallet,"body");
              pvVar3 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)pvVar3,"other_cosigners");
              pvVar3 = nlohmann::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       ::operator[](pvVar3,(long)device_address._4_4_);
              pvVar3 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)pvVar3,"device_hub");
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::dump((string_t *)&wallet_name,pvVar3,-1,' ',false,strict);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              std::__cxx11::string::~string((string *)&wallet_name);
              local_d0 = pcVar4;
              if ((((local_a8 != (void *)0x0) && (local_80 != (char *)0x0)) &&
                  (pcVar4 != (char *)0x0)) &&
                 ((sVar6 = strlen(pcVar4), sVar6 < 0x1e &&
                  (iVar2 = strcmp(local_80,byteduino_device.deviceAddress), iVar2 != 0)))) {
                newWallet.xPubKeyQueue[device_address._4_4_].isFree = false;
                memcpy(newWallet.xPubKeyQueue[device_address._4_4_].recipientPubKey,local_a8,0x2d);
                strcpy(newWallet.xPubKeyQueue[device_address._4_4_].recipientHub,local_d0);
              }
            }
          }
          newWallet.xPubKeyQueue[initiator_device_hub._4_4_ + 1].isFree = false;
          memcpy(newWallet.xPubKeyQueue[initiator_device_hub._4_4_ + 1].recipientPubKey,
                 package_local,0x2d);
          strcpy(newWallet.xPubKeyQueue[initiator_device_hub._4_4_ + 1].recipientHub,local_50);
          pvVar3 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)wallet,"body");
          pvVar3 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)pvVar3,"wallet_name");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::dump(&local_118,pvVar3,-1,' ',false,strict);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          std::__cxx11::string::~string((string *)&local_118);
          local_f8 = pcVar4;
          if ((pcVar4 != (char *)0x0) &&
             (bVar1 = std::type_info::operator==
                                ((type_info *)
                                 &nlohmann::
                                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                  ::typeinfo,
                                 (type_info *)
                                 &nlohmann::
                                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                  ::typeinfo), wallet_00 = local_20, pcVar4 = local_f8, bVar1)) {
            pvVar3 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                 *)wallet,"body");
            pvVar3 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                 *)pvVar3,"wallet_definition_template");
            saveWalletDefinitionInFlash(wallet_00,pcVar4,pvVar3);
            return;
          }
          poVar8 = std::operator<<((ostream *)&std::clog,
                                   "wallet_definition_template and wallet_name must be char");
          std::ostream::operator<<((ostream *)poVar8,std::endl<char,std::char_traits<char>>);
          return;
        }
        poVar8 = std::operator<<((ostream *)&std::clog,"other_cosigners cannot be empty");
        std::ostream::operator<<((ostream *)poVar8,std::endl<char,std::char_traits<char>>);
        return;
      }
    }
    poVar8 = std::operator<<((ostream *)&std::clog,"Wallet must single address wallet");
    std::ostream::operator<<((ostream *)poVar8,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void handleNewWalletRequest(char initiatorPubKey [45], nlohmann::json& package){
	const char* wallet = package["body"]["wallet"].dump().c_str();
	if (wallet != nullptr){
		if (typeid(package["body"]["is_single_address"]) == typeid(bool) && package["body"]["is_single_address"]){
			if(typeid(package["body"]["other_cosigners"]) == typeid(nlohmann::json)){
				int otherCosignersSize = package["body"]["other_cosigners"].size();
				if (!package["body"]["other_cosigners"].empty()){
					const char * initiator_device_hub = package["device_hub"].dump().c_str();
					if (initiator_device_hub != nullptr && strlen(initiator_device_hub) < MAX_HUB_STRING_SIZE){
						newWallet.isCreating = true;
						strcpy(newWallet.initiatorHub, initiator_device_hub);
						memcpy(newWallet.initiatorPubKey,initiatorPubKey,45);
						memcpy(newWallet.id,wallet,45);


						for (int i = 0; i < otherCosignersSize;i++){
							const  char* device_address = package["body"]["other_cosigners"][i]["device_address"].dump().c_str();
							const  char* pubkey = package["body"]["other_cosigners"][i]["pubkey"].dump().c_str();
							const  char* device_hub = package["body"]["other_cosigners"][i]["device_hub"].dump().c_str();

							if (pubkey != nullptr && device_address != nullptr && device_hub != nullptr){
								if (strlen(device_hub) < MAX_HUB_STRING_SIZE){
									if (strcmp(device_address, byteduino_device.deviceAddress) != 0){
										newWallet.xPubKeyQueue[i].isFree = false;
										memcpy(newWallet.xPubKeyQueue[i].recipientPubKey, pubkey,45);
										strcpy(newWallet.xPubKeyQueue[i].recipientHub, device_hub);
									}
								}

							}
						}
					}
					newWallet.xPubKeyQueue[otherCosignersSize+1].isFree = false;
					memcpy(newWallet.xPubKeyQueue[otherCosignersSize+1].recipientPubKey, initiatorPubKey, 45);
					strcpy(newWallet.xPubKeyQueue[otherCosignersSize+1].recipientHub, initiator_device_hub);

					const char* wallet_name = package["body"]["wallet_name"].dump().c_str();
					if (wallet_name != nullptr &&
                            typeid(package["body"]["wallet_definition_template"]) == typeid(nlohmann::json)){
						saveWalletDefinitionInFlash(wallet, wallet_name, package["body"]["wallet_definition_template"]);
					} else {
#ifdef DEBUG_PRINT
						std::clog << "wallet_definition_template and wallet_name must be char" << std::endl;
#endif
					}
				} else {
#ifdef DEBUG_PRINT
					std::clog << "other_cosigners cannot be empty" << std::endl;
#endif
				}
			} else {
#ifdef DEBUG_PRINT
				std::clog << "other_cosigners must be an array" << std::endl;
#endif
			}
		} else {
			std::clog << "Wallet must single address wallet" << std::endl;
		}
	} else {
#ifdef DEBUG_PRINT
		std::clog << "Wallet must be a char" << std::endl;
#endif
	}

}